

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSampleShadingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::MinSampleShadingValueClampingCase::iterate
          (MinSampleShadingValueClampingCase *this)

{
  ostringstream *this_00;
  TestLog *log;
  int iVar1;
  undefined4 extraout_var;
  CallLogWrapper gl;
  ResultCollector result;
  CallLogWrapper local_200;
  ResultCollector local_1e8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_200,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_198._0_8_ = local_198 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_198," // ERROR: ","");
  tcu::ResultCollector::ResultCollector(&local_1e8,log,(string *)local_198);
  if ((undefined1 *)local_198._0_8_ != local_198 + 0x10) {
    operator_delete((void *)local_198._0_8_,local_198._16_8_ + 1);
  }
  local_200.m_enableLog = true;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Verifying clamped values. Value is clamped when specified.",0x3a);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_120);
  glu::CallLogWrapper::glMinSampleShading(&local_200,-0.5);
  gls::StateQueryUtil::verifyStateFloat(&local_1e8,&local_200,0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&local_200,-1.0);
  gls::StateQueryUtil::verifyStateFloat(&local_1e8,&local_200,0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&local_200,-1.5);
  gls::StateQueryUtil::verifyStateFloat(&local_1e8,&local_200,0x8c37,0.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&local_200,1.5);
  gls::StateQueryUtil::verifyStateFloat(&local_1e8,&local_200,0x8c37,1.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&local_200,2.0);
  gls::StateQueryUtil::verifyStateFloat(&local_1e8,&local_200,0x8c37,1.0,QUERY_FLOAT);
  glu::CallLogWrapper::glMinSampleShading(&local_200,2.5);
  gls::StateQueryUtil::verifyStateFloat(&local_1e8,&local_200,0x8c37,1.0,QUERY_FLOAT);
  tcu::ResultCollector::setTestContextResult
            (&local_1e8,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_message._M_dataplus._M_p != &local_1e8.m_message.field_2) {
    operator_delete(local_1e8.m_message._M_dataplus._M_p,
                    local_1e8.m_message.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_prefix._M_dataplus._M_p != &local_1e8.m_prefix.field_2) {
    operator_delete(local_1e8.m_prefix._M_dataplus._M_p,
                    local_1e8.m_prefix.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::~CallLogWrapper(&local_200);
  return STOP;
}

Assistant:

MinSampleShadingValueClampingCase::IterateResult MinSampleShadingValueClampingCase::iterate (void)
{
	glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");
	gl.enableLogging(true);

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	// special values
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Verifying clamped values. Value is clamped when specified." << tcu::TestLog::EndMessage;

		gl.glMinSampleShading(-0.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(-1.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(-1.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 0.0, QUERY_FLOAT);

		gl.glMinSampleShading(1.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);

		gl.glMinSampleShading(2.0f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);

		gl.glMinSampleShading(2.5f);
		verifyStateFloat(result, gl, GL_MIN_SAMPLE_SHADING_VALUE, 1.0, QUERY_FLOAT);
	}

	result.setTestContextResult(m_testCtx);
	return STOP;
}